

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::PushMacroScope(cmMakefile *this,string *fileName,PolicyMap *pm)

{
  cmStateSnapshot *originSnapshot;
  bool bVar1;
  cmStateSnapshot local_38;
  
  originSnapshot = &this->StateSnapshot;
  cmState::CreateMacroCallSnapshot
            (&local_38,this->GlobalGenerator->CMakeInstance->State,originSnapshot,fileName);
  (this->StateSnapshot).Position.Position = local_38.Position.Position;
  (this->StateSnapshot).State = local_38.State;
  (this->StateSnapshot).Position.Tree = local_38.Position.Tree;
  bVar1 = cmStateSnapshot::IsValid(originSnapshot);
  if (bVar1) {
    PushFunctionBlockerBarrier(this);
    cmStateSnapshot::PushPolicy(originSnapshot,pm,true);
    return;
  }
  __assert_fail("this->StateSnapshot.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmMakefile.cxx"
                ,0x5a9,
                "void cmMakefile::PushMacroScope(const std::string &, const cmPolicies::PolicyMap &)"
               );
}

Assistant:

void cmMakefile::PushMacroScope(std::string const& fileName,
                                const cmPolicies::PolicyMap& pm)
{
  this->StateSnapshot =
    this->GetState()->CreateMacroCallSnapshot(this->StateSnapshot, fileName);
  assert(this->StateSnapshot.IsValid());

  this->PushFunctionBlockerBarrier();

  this->PushPolicy(true, pm);
}